

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

size_type __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  long *plVar1;
  long *plVar2;
  size_type sVar3;
  long *local_28;
  
  if ((long *)this->table_[b] == (long *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    plVar2 = (long *)this->table_[b];
    do {
      local_28 = plVar2;
      std::
      _Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,std::__cxx11::string>::InnerMap::KeyCompare,google::protobuf::Map<long,std::__cxx11::string>::MapAllocator<long*>>
      ::_M_insert_unique<long*>
                ((_Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,std::__cxx11::string>::InnerMap::KeyCompare,google::protobuf::Map<long,std::__cxx11::string>::MapAllocator<long*>>
                  *)tree,&local_28);
      sVar3 = sVar3 + 1;
      plVar1 = (long *)plVar2[2];
      plVar2[2] = 0;
      plVar2 = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return sVar3;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }